

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextIO.cpp
# Opt level: O0

iterator AddLogMsg(char *szPath,int ln,char *szFunc,logLevelTy lvl,char *szMsg,__va_list_tag *args)

{
  bool bVar1;
  char *pcVar2;
  iterator iVar3;
  char **in_RDI;
  char *in_R8;
  __gnuc_va_list in_R9;
  char *szFile;
  lock_guard<std::recursive_mutex> lock;
  mutex_type *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  DataRefs *in_stack_ffffffffffffffa0;
  char **in_stack_ffffffffffffffa8;
  list<LogMsgTy,_std::allocator<LogMsgTy>_> *in_stack_ffffffffffffffc0;
  
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)
             CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),in_stack_ffffffffffffff88
            );
  pcVar2 = strrchr((char *)in_RDI,0x2f);
  if (pcVar2 != (char *)0x0) {
    in_RDI = (char **)(pcVar2 + 1);
  }
  if (in_R9 != (__gnuc_va_list)0x0) {
    vsnprintf(gBuf,0xfd0,in_R8,in_R9);
    in_R8 = gBuf;
  }
  std::__cxx11::list<LogMsgTy,std::allocator<LogMsgTy>>::
  emplace_front<char_const*&,int&,char_const*&,logLevelTy&,char_const*>
            (in_stack_ffffffffffffffc0,in_RDI,(int *)in_R8,in_stack_ffffffffffffffa8,
             &in_stack_ffffffffffffffa0->pluginState,(char **)in_R8);
  bVar1 = DataRefs::IsXPThread(in_stack_ffffffffffffffa0);
  if (bVar1) {
    FlushMsg();
  }
  iVar3 = std::__cxx11::list<LogMsgTy,_std::allocator<LogMsgTy>_>::begin
                    ((list<LogMsgTy,_std::allocator<LogMsgTy>_> *)in_stack_ffffffffffffff88);
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x27d3a5);
  return (iterator)iVar3._M_node;
}

Assistant:

LogMsgListTy::iterator AddLogMsg (const char* szPath, int ln, const char* szFunc,
                                  logLevelTy lvl, const char* szMsg, va_list args)
{
    // We get the lock already to avoid having to lock twice if in main thread
    std::lock_guard<std::recursive_mutex> lock(gLogMutex);
    
    // Cut off path from file name
    const char* szFile = strrchr(szPath, PATH_DELIM);  // extract file from path
    if (!szFile) szFile = szPath; else szFile++;

    // Prepare the formatted string if variable arguments are given
    if (args)
        vsnprintf(gBuf, sizeof(gBuf), szMsg, args);

    // Add the list entry
    gLog.emplace_front(szFile, ln, szFunc, lvl,
                       args ? gBuf : szMsg);

    // Flush immediately if called from main thread
    if (dataRefs.IsXPThread())
        FlushMsg();
    
    // was added to the front
    return gLog.begin();
}